

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O3

bool __thiscall HPack::Decoder::decodeSizeUpdate(Decoder *this,BitIStream *inputStream)

{
  bool bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  long in_FS_OFFSET;
  quint32 maxSize;
  quint32 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0;
  sVar2 = BitIStream::read(inputStream,(int)&local_1c,in_RDX,in_RCX);
  if ((char)sVar2 == '\0') {
    BitIStream::error(inputStream);
    bVar1 = false;
  }
  else {
    bVar1 = FieldLookupTable::updateDynamicTableSize(&this->lookupTable,local_1c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Decoder::decodeSizeUpdate(BitIStream &inputStream)
{
    // For now, just read and skip bits.
    quint32 maxSize = 0;
    if (inputStream.read(&maxSize)) {
        if (!lookupTable.updateDynamicTableSize(maxSize))
            return false;

        return true;
    }

    handleStreamError(inputStream);
    return false;
}